

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int starma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  void *__s;
  void *__s_00;
  void *__dest;
  void *__s_01;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  void *pvVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  bool bVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  long local_98;
  int local_44;
  int local_3c;
  long lVar32;
  
  uVar25 = 2;
  if (-1 < iq) {
    uVar25 = (uint)ip >> 0x1f;
  }
  uVar7 = 4;
  if (iq * iq != 0 || ip * ip != 0) {
    uVar7 = uVar25;
  }
  uVar25 = iq + 1U;
  if ((int)(iq + 1U) <= ip) {
    uVar25 = ip;
  }
  uVar31 = (ulong)uVar25;
  uVar29 = 8;
  if (uVar25 != 1) {
    uVar29 = uVar7;
  }
  if (uVar29 == 0) {
    iVar6 = (uVar25 + 1) * uVar25;
    uVar26 = iVar6 / 2;
    uVar7 = uVar26 - 1;
    iVar20 = (int)(uVar7 * uVar26) / 2;
    lVar9 = (long)(int)uVar26;
    sVar1 = lVar9 * 8;
    __s = malloc(sVar1);
    __s_00 = malloc(sVar1);
    __dest = malloc(sVar1);
    __s_01 = malloc((long)iVar20 << 3);
    if (1 < (int)uVar25) {
      uVar17 = 1;
      do {
        A[uVar17] = 0.0;
        if ((long)ip <= (long)uVar17) {
          phi[uVar17] = 0.0;
        }
        V[uVar17] = 0.0;
        if ((long)uVar17 <= (long)iq) {
          V[uVar17] = theta[uVar17 - 1];
        }
        uVar17 = uVar17 + 1;
      } while (uVar31 != uVar17);
    }
    *A = 0.0;
    if (ip == 0) {
      *phi = 0.0;
    }
    *V = 1.0;
    if (1 < (int)uVar25) {
      uVar18 = 1;
      uVar15 = uVar31;
      pdVar13 = V;
      uVar17 = uVar31;
      do {
        uVar17 = uVar17 - 1;
        pdVar13 = pdVar13 + 1;
        dVar35 = V[uVar18];
        uVar23 = 0;
        do {
          V[(long)(int)uVar15 + uVar23] = pdVar13[uVar23] * dVar35;
          uVar23 = uVar23 + 1;
        } while (uVar17 != uVar23);
        uVar15 = (ulong)(uint)((int)uVar15 + (int)uVar23);
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar31);
    }
    if (ip == 0) {
      if (-1 < iq) {
        uVar7 = 1;
        uVar8 = uVar26;
        do {
          lVar9 = (long)(int)uVar8;
          uVar16 = 0;
          do {
            lVar9 = lVar9 + -1;
            dVar35 = V[lVar9];
            P[lVar9] = dVar35;
            if (uVar16 != 0) {
              lVar10 = (long)(int)uVar26;
              uVar26 = uVar26 - 1;
              P[lVar9] = dVar35 + P[lVar10 + -1];
            }
            uVar16 = uVar16 + 1;
          } while (uVar7 != uVar16);
          uVar8 = uVar8 - uVar16;
          bVar33 = uVar7 != uVar25;
          uVar7 = uVar7 + 1;
        } while (bVar33);
      }
    }
    else {
      if (1 < (int)(uVar7 * uVar26)) {
        memset(__s_01,0,(ulong)(iVar20 - 1) * 8 + 8);
      }
      if (1 < iVar6) {
        sVar1 = (ulong)uVar7 * 8 + 8;
        memset(P,0,sVar1);
        memset(__s_00,0,sVar1);
        memset(__s,0,sVar1);
      }
      uVar8 = uVar26 - uVar25;
      lVar10 = (long)(int)uVar8;
      uVar17 = (ulong)uVar26;
      if (0 < (int)uVar25) {
        iVar28 = uVar8 - 1;
        uVar18 = (ulong)(uVar25 - 1);
        local_3c = -1;
        uVar23 = 0;
        lVar32 = 0;
        uVar15 = uVar31;
        local_98 = lVar10;
        do {
          dVar35 = phi[uVar23];
          *(undefined8 *)((long)__s + local_98 * 8) = 0;
          local_98 = local_98 + 1;
          iVar30 = (int)lVar32;
          lVar32 = (long)iVar30;
          local_44 = uVar8 + 1 + (int)uVar23;
          uVar27 = uVar23;
          do {
            dVar34 = phi[uVar27];
            if ((uVar23 != uVar18) &&
               (*(double *)((long)__s + local_98 * 8) = -dVar34, uVar27 != uVar18)) {
              *(double *)((long)__s + (long)local_44 * 8) =
                   *(double *)((long)__s + (long)local_44 * 8) - dVar35;
              lVar11 = (long)local_3c;
              local_3c = local_3c + 1;
              *(undefined8 *)((long)__s + lVar11 * 8 + 8) = 0xbff0000000000000;
            }
            dVar38 = V[lVar32];
            iVar28 = iVar28 + 1;
            if ((int)uVar26 <= iVar28) {
              iVar28 = 0;
            }
            *(double *)((long)__s + lVar10 * 8) = -dVar34 * dVar35;
            lVar11 = (long)iVar28;
            *(double *)((long)__s + lVar11 * 8) = *(double *)((long)__s + lVar11 * 8) + 1.0;
            dVar34 = 1.0;
            if (1 < iVar6) {
              memcpy(__dest,__s,uVar17 * 8);
              uVar12 = 0;
              iVar21 = 0;
              dVar34 = 1.0;
              pvVar14 = __dest;
              uVar19 = uVar17;
              do {
                uVar19 = uVar19 - 1;
                pvVar14 = (void *)((long)pvVar14 + 8);
                dVar2 = *(double *)((long)__dest + uVar12 * 8);
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  dVar3 = P[uVar12];
                  dVar37 = dVar34 * dVar2 * dVar2 + dVar3;
                  P[uVar12] = dVar37;
                  dVar36 = dVar3 / dVar37;
                  dVar37 = (dVar34 * dVar2) / dVar37;
                  if (uVar12 + 1 < uVar17 && uVar12 != uVar7) {
                    uVar24 = 0;
                    do {
                      dVar4 = *(double *)((long)pvVar14 + uVar24 * 8);
                      dVar5 = *(double *)((long)__s_01 + uVar24 * 8 + (long)iVar21 * 8);
                      *(double *)((long)pvVar14 + uVar24 * 8) = -dVar2 * dVar5 + dVar4;
                      *(double *)((long)__s_01 + uVar24 * 8 + (long)iVar21 * 8) =
                           dVar5 * dVar36 + dVar4 * dVar37;
                      uVar24 = uVar24 + 1;
                    } while (uVar19 != uVar24);
                    iVar21 = iVar21 + (int)uVar24;
                  }
                  dVar4 = *(double *)((long)__s_00 + uVar12 * 8);
                  *(double *)((long)__s_00 + uVar12 * 8) = dVar36 * dVar4 + dVar37 * dVar38;
                  if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_00112436;
                  dVar34 = dVar34 * dVar36;
                  dVar38 = dVar38 - dVar2 * dVar4;
                }
                else {
                  iVar21 = iVar21 + ~(uint)uVar12 + uVar26;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar17);
            }
            if (dVar34 < 0.0) {
              sqrt(dVar34);
            }
LAB_00112436:
            *(undefined8 *)((long)__s + lVar11 * 8) = 0;
            if (uVar27 != uVar18) {
              *(undefined8 *)((long)__s + (long)local_44 * 8) = 0;
              local_44 = local_44 + 1;
              *(undefined8 *)((long)__s + (long)local_3c * 8) = 0;
            }
            lVar32 = lVar32 + 1;
            uVar27 = uVar27 + 1;
          } while (iVar30 + (int)uVar15 != (int)lVar32);
          uVar23 = uVar23 + 1;
          uVar15 = (ulong)((int)uVar15 - 1);
        } while (uVar23 != uVar31);
      }
      if (1 < iVar6) {
        iVar20 = iVar20 + -1;
        lVar32 = uVar17 * 8;
        uVar16 = 0;
        do {
          uVar17 = uVar17 - 1;
          dVar35 = *(double *)((long)__s_00 + uVar17 * 8);
          if (uVar16 != 0 && uVar17 != (long)(int)uVar7) {
            lVar11 = 0;
            uVar22 = 0;
            do {
              dVar35 = dVar35 - *(double *)((long)__s_01 + lVar11 + (long)iVar20 * 8) *
                                *(double *)((long)P + lVar11 + lVar32 + -8);
              uVar22 = uVar22 + 1;
              lVar11 = lVar11 + -8;
            } while (uVar16 != uVar22);
            iVar20 = iVar20 - uVar22;
          }
          P[uVar17] = dVar35;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar26);
      }
      if (0 < (int)uVar25) {
        memcpy(__s,P + lVar10,uVar31 * 8);
      }
      if (0 < (int)uVar8) {
        pdVar13 = P + ((ulong)uVar8 - 1);
        lVar10 = (long)iq + 1;
        if ((long)iq + 1 <= (long)ip) {
          lVar10 = (long)ip;
        }
        do {
          P[lVar9 + -1] = *pdVar13;
          lVar9 = lVar9 + -1;
          pdVar13 = pdVar13 + -1;
        } while ((int)lVar10 != (int)lVar9);
      }
      if (0 < (int)uVar25) {
        memcpy(P,__s,uVar31 << 3);
      }
    }
    free(__s);
    free(__s_00);
    free(__dest);
    free(__s_01);
  }
  return uVar29;
}

Assistant:

int starma(int ip, int iq,double *phi,double *theta,double *A,double *P,double *V) {
	int ifault,ir,np,nrbar,i,ind,j,ir1,irank,ifail;
	int npr, npr1, ind1, ind2, indj,indi,indn;
	double vj,ssqerr,phij,phii,ynext,weight,recres;
	double *thetab, *xnext, *xrow, *rbar;
	ifault = 0;
	/*
	c   algorithm as 154 appl. statist. (1980) vol.29, no.3
	c
	c   invoking this subroutine sets the values of v and phi, and obtains
	c   the initial values of a and p.
	c   this routine is not suitable for use with an ar(1) process.
	c   in this case the following instructions should be used for
	c   initialisation.
	c          v(1)=1.0
	c          a(1)=0.0
	c          p(1)=1.0/(1.0-phi(1)*phi(1))
	c
	*/

	// Check for input errors

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = 2;
	}

	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;

	if (ir == 1) {
		ifault = 8;
	}
	
	if (ifault != 0) {
		return ifault;
	}

	xnext = (double*)malloc(sizeof(double)* np);
	thetab = (double*)malloc(sizeof(double)* np);
	xrow = (double*)malloc(sizeof(double)* np);
	rbar = (double*)malloc(sizeof(double)* nrbar);

	for (i = 1; i < ir;++i) {
		A[i] = 0.0;
		if (i >= ip) {
			phi[i] = 0.0;
		}
		V[i] = 0.0;
		if (i < iq+1) {
			V[i] = theta[i - 1];
		}
	}

	A[0] = 0.0;
	if (ip == 0) {
		phi[0] = 0.0;
	}
	V[0] = 1.0;
	ind = ir;

	for (j = 1; j < ir; ++j) {
		vj = V[j];
		for (i = j; i < ir; ++i) {
			V[ind] = V[i] * vj;
			ind++;
		}
	}

	if (ip != 0) {//300
		/*
		c   now find p(0).

c   the set of equations s*vec(p(0))=vec(v) is solved for vec(p(0)).
c   s is generated row by row in the array xnext.
c   the order of elements in p is changed, so as to bring more leading
c   zeros into the rows of s, hence achieving a reduction of computing
c   time.
		*/
		ir1 = ir - 1;
		irank = 0;
		ifail = 0;
		ssqerr = 0.0;

		for (i = 0; i < nrbar; ++i) {
			rbar[i] = 0.0;
		}
		for (i = 0; i < np; ++i) {
			P[i] = 0.0;
			thetab[i] = 0.0;
			xnext[i] = 0.0;
		}
		ind = 0;
		ind1 = -1;
		npr = np - ir;
		npr1 = npr + 1;
		indj = npr;
		ind2 = npr-1;

		for (j = 0; j < ir; ++j) {//110
			phij = phi[j];
			xnext[indj] = 0.0;
			indj = indj + 1;
			indi = npr1 + j;

			for (i = j; i < ir; ++i) {//110
				ynext = V[ind];
				ind++;
				phii = phi[i];
				if (j != (ir - 1)) {
					xnext[indj] = -phii;
					if (i != (ir - 1)) {
						xnext[indi] -= phij;
						ind1 ++;
						xnext[ind1] = -1.0;
					}
				}//100
				xnext[npr] = -phii*phij;
				ind2++;
				if (ind2 >= np) {
					ind2 = 0;
				}
				xnext[ind2] += 1.0;
				weight = 1.0;
				ifail = inclu2(np, nrbar, weight, xnext, xrow, ynext, P, rbar, thetab, &ssqerr, &recres, &irank);
				//mdisplay(P, 1, np);
				xnext[ind2] = 0.0;
				if (i != (ir - 1)) {
					xnext[indi] = 0.0;
					indi++;
					xnext[ind1] = 0.0;
				}
			}//110
		}//110
		//mdisplay(P, 1, np);
		regres(np, nrbar, rbar, thetab, P);
		/*
		Now Re-order P
		*/
		ind = npr;
		for (i = 0; i < ir; ++i) {
			ind++;
			xnext[i] = P[ind - 1];
		}
		ind = np;
		ind1 = npr;

		for (i = 0; i < npr; ++i) {
			P[ind - 1] = P[ind1 - 1];
			ind--;
			ind1--;
		}

		for (i = 0; i < ir; ++i) {
			P[i] = xnext[i];
		}
		//return ifault;
	}
	else {

		// P[0] is obtained by back-substitution for a Moving Average process

		indn = np;
		ind = np;
		for (i = 0; i < ir; i++) {
			for (j = 0; j <= i; j++) {
				ind--;
				P[ind] = V[ind];
				if (j != 0)  {
					indn--;
					P[ind] += P[indn];
				}
			}
		}
	}

	free(xnext);
	free(thetab);
	free(xrow);
	free(rbar);
	return ifault;
}